

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O1

void WebPInitSamplers(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&WebPInitSamplers::WebPInitSamplers_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (WebPInitSamplers::WebPInitSamplers_body_last_cpuinfo_used != VP8GetCPUInfo) {
    WebPSamplers[0] = YuvToRgbRow;
    WebPSamplers[1] = YuvToRgbaRow;
    WebPSamplers[2] = YuvToBgrRow;
    WebPSamplers[3] = YuvToBgraRow;
    WebPSamplers[4] = YuvToArgbRow;
    WebPSamplers[5] = YuvToRgba4444Row;
    WebPSamplers[6] = YuvToRgb565Row;
    WebPSamplers[7] = YuvToRgbaRow;
    WebPSamplers[8] = YuvToBgraRow;
    WebPSamplers[9] = YuvToArgbRow;
    WebPSamplers[10] = YuvToRgba4444Row;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        WebPInitSamplersSSE2();
      }
      iVar1 = (*VP8GetCPUInfo)(kSSE4_1);
      if (iVar1 != 0) {
        WebPInitSamplersSSE41();
      }
    }
  }
  WebPInitSamplers::WebPInitSamplers_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock((pthread_mutex_t *)&WebPInitSamplers::WebPInitSamplers_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(WebPInitSamplers) {
  WebPSamplers[MODE_RGB]       = YuvToRgbRow;
  WebPSamplers[MODE_RGBA]      = YuvToRgbaRow;
  WebPSamplers[MODE_BGR]       = YuvToBgrRow;
  WebPSamplers[MODE_BGRA]      = YuvToBgraRow;
  WebPSamplers[MODE_ARGB]      = YuvToArgbRow;
  WebPSamplers[MODE_RGBA_4444] = YuvToRgba4444Row;
  WebPSamplers[MODE_RGB_565]   = YuvToRgb565Row;
  WebPSamplers[MODE_rgbA]      = YuvToRgbaRow;
  WebPSamplers[MODE_bgrA]      = YuvToBgraRow;
  WebPSamplers[MODE_Argb]      = YuvToArgbRow;
  WebPSamplers[MODE_rgbA_4444] = YuvToRgba4444Row;

  // If defined, use CPUInfo() to overwrite some pointers with faster versions.
  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      WebPInitSamplersSSE2();
    }
#endif  // WEBP_HAVE_SSE2
#if defined(WEBP_HAVE_SSE41)
    if (VP8GetCPUInfo(kSSE4_1)) {
      WebPInitSamplersSSE41();
    }
#endif  // WEBP_HAVE_SSE41
#if defined(WEBP_USE_MIPS32)
    if (VP8GetCPUInfo(kMIPS32)) {
      WebPInitSamplersMIPS32();
    }
#endif  // WEBP_USE_MIPS32
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      WebPInitSamplersMIPSdspR2();
    }
#endif  // WEBP_USE_MIPS_DSP_R2
  }
}